

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.h
# Opt level: O2

bool __thiscall FIX::TimeRange::isInRange(TimeRange *this,UtcTimeStamp *dateTime)

{
  bool bVar1;
  int iVar2;
  LocalTimeStamp localDateTime;
  DateTime DStack_28;
  
  if (this->m_useLocalTime == true) {
    LocalTimeStamp::LocalTimeStamp
              ((LocalTimeStamp *)&DStack_28,
               (long)(dateTime->super_DateTime).m_date * 0x15180 + -0x3118a41200 +
               (dateTime->super_DateTime).m_time / 1000000000,0);
    iVar2 = DateTime::getWeekDay(&DStack_28);
    bVar1 = isInRange(this,&DStack_28,iVar2);
    return bVar1;
  }
  iVar2 = DateTime::getWeekDay(&dateTime->super_DateTime);
  bVar1 = isInRange(this,&dateTime->super_DateTime,iVar2);
  return bVar1;
}

Assistant:

bool isInRange(const UtcTimeStamp &dateTime) {
    if (m_useLocalTime) {
      LocalTimeStamp localDateTime(dateTime.getTimeT());
      return isInRange(localDateTime, localDateTime.getWeekDay());
    }

    return isInRange(dateTime, dateTime.getWeekDay());
  }